

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O2

bool __thiscall Heuristics::existsInVisited(Heuristics *this,Table possibleState)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  pointer pTVar4;
  Table table;
  Table local_38;
  
  pTVar1 = (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pTVar4 = pTVar2;
    if (pTVar4 == pTVar1) break;
    local_38.current_col = pTVar4->current_col;
    local_38.evaluationScore = pTVar4->evaluationScore;
    local_38.table._0_8_ = *(undefined8 *)pTVar4->table;
    local_38._8_8_ = *(undefined8 *)(pTVar4->table[2] + 2);
    bVar3 = Table::equals(&local_38,possibleState);
    pTVar2 = pTVar4 + 1;
  } while (!bVar3);
  return pTVar4 != pTVar1;
}

Assistant:

bool Heuristics::existsInVisited(Table possibleState) {
    for (auto table : this->visited) {
        if(table.equals(possibleState)){
            return true;
        }
    }
    return false;
}